

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDouble(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_228;
  int local_224;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  char Buffer [500];
  Abc_Ntk_t *pNtk_local;
  
  unique0x10000674 = pNtk;
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 != 0) {
    pNtkNew_00 = Abc_NtkAlloc(stack0xfffffffffffffff0->ntkType,stack0xfffffffffffffff0->ntkFunc,1);
    sprintf((char *)&pNtkNew,"%s%s",stack0xfffffffffffffff0->pName,"_2x");
    pcVar2 = Extra_UtilStrsav((char *)&pNtkNew);
    pNtkNew_00->pName = pcVar2;
    Abc_NtkCleanCopy(stack0xfffffffffffffff0);
    for (local_224 = 0; iVar1 = Abc_NtkPiNum(stack0xfffffffffffffff0), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkPi(stack0xfffffffffffffff0,local_224);
      Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
    }
    for (local_224 = 0; iVar1 = Abc_NtkPoNum(stack0xfffffffffffffff0), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkPo(stack0xfffffffffffffff0,local_224);
      Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
    }
    for (local_224 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vBoxes), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkBox(stack0xfffffffffffffff0,local_224);
      Abc_NtkDupBox(pNtkNew_00,pAVar3,0);
    }
    for (local_224 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,local_224);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
      }
    }
    for (local_224 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,local_224);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pAVar3), iVar1 == 0)) &&
         (iVar1 = Abc_ObjIsBo(pAVar3), iVar1 == 0)) {
        for (local_228 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_228 < iVar1;
            local_228 = local_228 + 1) {
          pAVar4 = Abc_ObjFanin(pAVar3,local_228);
          Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar4->field_6).pCopy);
        }
      }
    }
    Abc_NtkCleanCopy(stack0xfffffffffffffff0);
    for (local_224 = 0; iVar1 = Abc_NtkPiNum(stack0xfffffffffffffff0), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkPi(stack0xfffffffffffffff0,local_224);
      Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
    }
    for (local_224 = 0; iVar1 = Abc_NtkPoNum(stack0xfffffffffffffff0), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkPo(stack0xfffffffffffffff0,local_224);
      Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
    }
    for (local_224 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vBoxes), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkBox(stack0xfffffffffffffff0,local_224);
      Abc_NtkDupBox(pNtkNew_00,pAVar3,0);
    }
    for (local_224 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,local_224);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
      }
    }
    for (local_224 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,local_224);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pAVar3), iVar1 == 0)) &&
         (iVar1 = Abc_ObjIsBo(pAVar3), iVar1 == 0)) {
        for (local_228 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_228 < iVar1;
            local_228 = local_228 + 1) {
          pAVar4 = Abc_ObjFanin(pAVar3,local_228);
          Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar4->field_6).pCopy);
        }
      }
    }
    for (local_224 = 0; iVar1 = Abc_NtkCiNum(stack0xfffffffffffffff0), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkCi(stack0xfffffffffffffff0,local_224);
      pAVar4 = Abc_NtkCi(pNtkNew_00,local_224);
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,"1_",pcVar2);
      iVar1 = Abc_NtkCiNum(stack0xfffffffffffffff0);
      pAVar4 = Abc_NtkCi(pNtkNew_00,iVar1 + local_224);
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,"2_",pcVar2);
    }
    for (local_224 = 0; iVar1 = Abc_NtkCoNum(stack0xfffffffffffffff0), local_224 < iVar1;
        local_224 = local_224 + 1) {
      pAVar3 = Abc_NtkCo(stack0xfffffffffffffff0,local_224);
      pAVar4 = Abc_NtkCo(pNtkNew_00,local_224);
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,"1_",pcVar2);
      iVar1 = Abc_NtkCoNum(stack0xfffffffffffffff0);
      pAVar4 = Abc_NtkCo(pNtkNew_00,iVar1 + local_224);
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,"2_",pcVar2);
    }
    Abc_NtkOrderCisCos(pNtkNew_00);
    iVar1 = Abc_NtkCheck(pNtkNew_00);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkDup(): Network check has failed.\n");
    }
    return pNtkNew_00;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x2a4,"Abc_Ntk_t *Abc_NtkDouble(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDouble( Abc_Ntk_t * pNtk )
{
    char Buffer[500];
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    sprintf( Buffer, "%s%s", pNtk->pName, "_2x" );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // assign names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_NtkCi(pNtkNew,                      i), "1_", Abc_ObjName(pObj) );
        Abc_ObjAssignName( Abc_NtkCi(pNtkNew, Abc_NtkCiNum(pNtk) + i), "2_", Abc_ObjName(pObj) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_NtkCo(pNtkNew,                      i), "1_", Abc_ObjName(pObj) );
        Abc_ObjAssignName( Abc_NtkCo(pNtkNew, Abc_NtkCoNum(pNtk) + i), "2_", Abc_ObjName(pObj) );
    }
    Abc_NtkOrderCisCos( pNtkNew );

    // perform the final check
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    return pNtkNew;
}